

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CProgram *statement)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  reference this_00;
  pointer pCVar4;
  __normal_iterator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_*,_std::vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_*,_std::vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>_>
  local_28;
  iterator it;
  vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
  *classDeclarations;
  CProgram *statement_local;
  CBuildVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CProgram\n");
  pCVar2 = std::unique_ptr<CMainClass,_std::default_delete<CMainClass>_>::operator->
                     (&statement->mainClass);
  (**(pCVar2->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  pCVar3 = std::unique_ptr<CClassList,_std::default_delete<CClassList>_>::operator->
                     (&statement->classList);
  it._M_current = (unique_ptr<CClass,_std::default_delete<CClass>_> *)&pCVar3->classes;
  local_28._M_current =
       (unique_ptr<CClass,_std::default_delete<CClass>_> *)
       std::
       vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
       ::begin((vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                *)it._M_current);
  while( true ) {
    local_30._M_current =
         (unique_ptr<CClass,_std::default_delete<CClass>_> *)
         std::
         vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
         ::end((vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                *)it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_*,_std::vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>_>
              ::operator*(&local_28);
    pCVar4 = std::unique_ptr<CClass,_std::default_delete<CClass>_>::operator->(this_00);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_*,_std::vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CProgram &statement ) {
    std::cout << "IRT builder: CProgram\n";
    statement.mainClass->Accept( *this );
    std::vector<std::unique_ptr<CClass>> &classDeclarations = statement.classList->classes;
    for ( auto it = classDeclarations.begin( ); it != classDeclarations.end( ); ++it ) {
        ( *it )->Accept( *this );
    }
}